

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

int fit_iforest(IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *numeric_data,
               size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,double *Xc,
               size_t *Xc_ind,size_t *Xc_indptr,size_t ndim,size_t ntry,CoefType coef_type,
               bool coef_by_prop,double *sample_weights,bool with_replacement,bool weight_as_sample,
               size_t nrows,size_t sample_size,size_t ntrees,size_t max_depth,size_t ncols_per_tree,
               bool limit_depth,bool penalize_range,bool standardize_data,
               ScoringMetric scoring_metric,bool fast_bratio,bool standardize_dist,double *tmat,
               double *output_depths,bool standardize_depth,double *col_weights,bool weigh_by_kurt,
               double prob_pick_by_gain_pl,double prob_pick_by_gain_avg,
               double prob_pick_by_full_gain,double prob_pick_by_dens,double prob_pick_col_by_range,
               double prob_pick_col_by_var,double prob_pick_col_by_kurt,double min_gain,
               MissingAction missing_action,CategSplit cat_split_type,NewCategAction new_cat_action,
               bool all_perm,Imputer *imputer,size_t min_imp_obs,UseDepthImp depth_imp,
               WeighImpRows weigh_imp_rows,bool impute_at_fit,uint64_t random_seed,
               bool use_long_double,int nthreads)

{
  int iVar1;
  undefined8 unaff_RBP;
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  bool in_stack_00000046;
  bool in_stack_00000047;
  bool in_stack_00000048;
  bool in_stack_00000049;
  bool in_stack_0000004a;
  bool in_stack_0000004b;
  bool in_stack_0000004c;
  bool in_stack_0000004d;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  undefined1 in_stack_00000050;
  undefined7 in_stack_00000051;
  undefined1 in_stack_00000058;
  undefined7 in_stack_00000059;
  size_t in_stack_00000060;
  double *in_stack_00000068;
  ExtIsoForest *in_stack_00000070;
  IsoForest *in_stack_00000078;
  int *in_stack_000000c0;
  undefined1 in_stack_000000c8;
  undefined7 in_stack_000000c9;
  unsigned_long *in_stack_000000d0;
  undefined1 in_stack_000000d8;
  undefined7 in_stack_000000d9;
  undefined4 in_stack_000000e0;
  undefined4 in_stack_000000e4;
  undefined4 in_stack_000000e8;
  undefined4 in_stack_000000ec;
  CoefType in_stack_000000f0;
  double *in_stack_00000100;
  undefined4 in_stack_00000118;
  undefined4 in_stack_0000011c;
  undefined1 in_stack_00000120;
  undefined7 in_stack_00000121;
  size_t in_stack_00000128;
  undefined1 in_stack_00000130;
  undefined7 in_stack_00000131;
  undefined4 in_stack_00000138;
  undefined4 in_stack_0000013c;
  ScoringMetric in_stack_00000158;
  double *in_stack_00000170;
  double *in_stack_00000178;
  double *in_stack_00000188;
  MissingAction in_stack_00000198;
  CategSplit in_stack_000001a0;
  NewCategAction in_stack_000001a8;
  Imputer *in_stack_000001b8;
  size_t in_stack_000001c0;
  UseDepthImp in_stack_000001c8;
  WeighImpRows in_stack_000001d0;
  uint64_t in_stack_000001e0;
  int in_stack_000001f0;
  
  iVar1 = fit_iforest<double,unsigned_long>
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                     (int *)CONCAT71(in_stack_00000059,in_stack_00000058),
                     CONCAT71(in_stack_00000051,in_stack_00000050),in_stack_000000c0,
                     (double *)CONCAT71(in_stack_000000c9,in_stack_000000c8),in_stack_000000d0,
                     (unsigned_long *)CONCAT71(in_stack_000000d9,in_stack_000000d8),
                     CONCAT44(in_stack_000000e4,in_stack_000000e0),
                     CONCAT44(in_stack_000000ec,in_stack_000000e8),in_stack_000000f0,
                     in_stack_0000004f,in_stack_00000100,in_stack_0000004e,in_stack_0000004d,
                     CONCAT44(in_stack_0000011c,in_stack_00000118),
                     CONCAT71(in_stack_00000121,in_stack_00000120),in_stack_00000128,
                     CONCAT71(in_stack_00000131,in_stack_00000130),
                     CONCAT44(in_stack_0000013c,in_stack_00000138),in_stack_0000004c,
                     in_stack_0000004b,in_stack_0000004a,in_stack_00000158,in_stack_00000049,
                     in_stack_00000048,in_stack_00000170,in_stack_00000178,in_stack_00000047,
                     in_stack_00000188,in_stack_00000046,
                     (double)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                     in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,in_stack_00000198,in_stack_000001a0,
                     in_stack_000001a8,SUB81((ulong)unaff_RBP >> 0x38,0),in_stack_000001b8,
                     in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                     SUB81((ulong)unaff_RBP >> 0x30,0),in_stack_000001e0,
                     SUB81((ulong)unaff_RBP >> 0x28,0),in_stack_000001f0);
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED int fit_iforest(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                real_t numeric_data[],  size_t ncols_numeric,
                int    categ_data[],    size_t ncols_categ,    int ncat[],
                real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
                real_t sample_weights[], bool with_replacement, bool weight_as_sample,
                size_t nrows, size_t sample_size, size_t ntrees,
                size_t max_depth,   size_t ncols_per_tree,
                bool   limit_depth, bool penalize_range, bool standardize_data,
                ScoringMetric scoring_metric, bool fast_bratio,
                bool   standardize_dist, double tmat[],
                double output_depths[], bool standardize_depth,
                real_t col_weights[], bool weigh_by_kurt,
                double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
                double prob_pick_by_full_gain, double prob_pick_by_dens,
                double prob_pick_col_by_range, double prob_pick_col_by_var,
                double prob_pick_col_by_kurt,
                double min_gain, MissingAction missing_action,
                CategSplit cat_split_type, NewCategAction new_cat_action,
                bool   all_perm, Imputer *imputer, size_t min_imp_obs,
                UseDepthImp depth_imp, WeighImpRows weigh_imp_rows, bool impute_at_fit,
                uint64_t random_seed, bool use_long_double, int nthreads)
{
    return fit_iforest<real_t, sparse_ix>
               (model_outputs, model_outputs_ext,
                numeric_data,  ncols_numeric,
                categ_data,    ncols_categ,    ncat,
                Xc, Xc_ind, Xc_indptr,
                ndim, ntry, coef_type, coef_by_prop,
                sample_weights, with_replacement, weight_as_sample,
                nrows, sample_size, ntrees,
                max_depth,   ncols_per_tree,
                limit_depth, penalize_range, standardize_data,
                scoring_metric, fast_bratio,
                standardize_dist, tmat,
                output_depths, standardize_depth,
                col_weights, weigh_by_kurt,
                prob_pick_by_gain_pl, prob_pick_by_gain_avg,
                prob_pick_by_full_gain, prob_pick_by_dens,
                prob_pick_col_by_range, prob_pick_col_by_var,
                prob_pick_col_by_kurt,
                min_gain, missing_action,
                cat_split_type, new_cat_action,
                all_perm, imputer, min_imp_obs,
                depth_imp, weigh_imp_rows, impute_at_fit,
                random_seed, use_long_double, nthreads);
}